

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaNormalTargetGenerator::WriteLinkRule
          (cmNinjaNormalTargetGenerator *this,bool useResponseFile,string *config)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *target;
  cmLocalNinjaGenerator *pcVar2;
  cmRulePlaceholderExpander *pcVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  TargetType targetType;
  int iVar6;
  cmGlobalNinjaGenerator *pcVar7;
  string *psVar8;
  cmValue cVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  char *pcVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  char *pcVar12;
  pointer pbVar13;
  pointer pcVar14;
  string *linkCmd;
  pointer s;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string_view source;
  string_view source_00;
  string linker;
  string responseFlag;
  string lang;
  string cmakeLinkVar;
  string cmakeVarLang;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  string targetVersionMinor;
  string targetVersionMajor;
  string langFlags;
  string linkRuleName;
  string launcher;
  string linkerLauncher;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  ostringstream majorStream;
  string val;
  ostringstream minorStream;
  Names tgtNames;
  undefined1 local_868 [40];
  string local_840;
  char *local_820;
  undefined8 local_818;
  string *local_808;
  undefined1 local_800 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7d0;
  string local_7c0;
  string local_7a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_780;
  cmRulePlaceholderExpander *local_768;
  cmRulePlaceholderExpander *local_760;
  undefined8 local_758;
  undefined1 local_750 [16];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  _Base_ptr local_720;
  _Base_ptr local_718;
  undefined1 local_710 [24];
  _Base_ptr local_6f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6f0;
  string local_6e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6c0;
  undefined1 local_6b8 [24];
  string local_6a0;
  RuleVariables *local_680;
  pointer local_678;
  undefined1 local_670 [16];
  char *local_660;
  char *local_658;
  char local_650;
  undefined7 uStack_64f;
  char *pcStack_648;
  char *local_640;
  char *local_638;
  char local_630;
  undefined7 uStack_62f;
  char *pcStack_628;
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  _Alloc_hider local_600;
  cmRulePlaceholderExpander *local_5f8;
  undefined1 local_5f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d0;
  _Alloc_hider local_5c0;
  char *local_5b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b0;
  _Alloc_hider local_5a0;
  char *local_598;
  undefined1 local_590 [16];
  _Alloc_hider local_580;
  char *local_578;
  _Rb_tree_node_base local_570;
  _Rb_tree_node_base local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  _Alloc_hider local_520;
  char *local_518;
  undefined1 local_510 [16];
  bool local_500;
  char *local_4f8 [6];
  undefined1 local_4c8 [17];
  undefined7 uStack_4b7;
  undefined1 auStack_4b0 [8];
  char *local_4a8;
  string *local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  _Alloc_hider local_488;
  char *local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  _Alloc_hider local_468;
  char *local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_458;
  _Alloc_hider local_448;
  char *local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  _Alloc_hider local_428;
  char *local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418;
  _Alloc_hider local_408;
  char *local_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  _Alloc_hider local_3e8;
  char *local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  _Alloc_hider local_3c8;
  char *local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  bool local_3a8;
  string local_350;
  string local_330;
  string local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  undefined8 local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  undefined1 local_2d0 [32];
  _Alloc_hider local_2b0;
  size_type local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  _Alloc_hider local_290;
  char *local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Alloc_hider local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _Alloc_hider local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  _Alloc_hider local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  _Alloc_hider local_1f0;
  size_type local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  _Alloc_hider local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  bool local_1b0;
  undefined1 local_158 [32];
  _Alloc_hider local_138;
  size_t local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _Alloc_hider local_118;
  size_t local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  char *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  char *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  char *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  char *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _Alloc_hider local_58;
  char *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  bool local_38;
  
  targetType = cmGeneratorTarget::GetType
                         ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget);
  LanguageLinkerRule((string *)(local_710 + 0x10),this,config);
  pcVar7 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar5 = cmGlobalNinjaGenerator::HasRule(pcVar7,(string *)(local_710 + 0x10));
  p_Var4 = local_6f8;
  local_808 = config;
  if (bVar5) goto LAB_00481690;
  local_2f0 = &local_2e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710._16_8_ == &local_6f0) {
    local_2e0._8_8_ = local_6f0._8_8_;
    local_710._16_8_ = local_2f0;
  }
  local_6f8 = (_Base_ptr)0x0;
  local_6f0._M_local_buf[0] = '\0';
  local_158._0_8_ = local_710._16_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710._16_8_ == local_2f0) {
    local_158._24_8_ = local_2e0._8_8_;
    local_158._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_158 + 0x10);
  }
  local_138._M_p = (pointer)&local_128;
  local_158._8_8_ = p_Var4;
  local_2e8 = 0;
  local_2e0._M_allocated_capacity = (ulong)(uint7)local_6f0._M_allocated_capacity._1_7_ << 8;
  local_130 = 0;
  local_128._M_local_buf[0] = '\0';
  local_118._M_p = (pointer)&local_108;
  local_110 = 0;
  local_108._M_local_buf[0] = '\0';
  local_f8._M_p = (pointer)&local_e8;
  local_f0 = (char *)0x0;
  local_e8._M_local_buf[0] = '\0';
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = (char *)0x0;
  local_c8._M_local_buf[0] = '\0';
  local_b8._M_p = (pointer)&local_a8;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  local_98._M_p = (pointer)&local_88;
  local_90 = (char *)0x0;
  local_88._M_local_buf[0] = '\0';
  local_78._M_p = (pointer)&local_68;
  local_70 = (char *)0x0;
  local_68._M_local_buf[0] = '\0';
  local_58._M_p = (pointer)&local_48;
  local_50 = (char *)0x0;
  local_48._M_local_buf[0] = '\0';
  local_38 = false;
  local_710._16_8_ = &local_6f0;
  memset(local_620,0,0x158);
  psVar8 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                      GeneratorTarget);
  local_620._0_8_ = (psVar8->_M_dataplus)._M_p;
  psVar8 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
  local_620._8_8_ = (psVar8->_M_dataplus)._M_p;
  cmGeneratorTarget::GetLinkerTool
            ((string *)local_868,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  local_570._M_left = (_Base_ptr)local_868._0_8_;
  cmGeneratorTarget::GetLinkerLanguage
            ((string *)&local_7e0,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  local_5f0._0_8_ = local_7e0._M_allocated_capacity;
  local_5f0._8_8_ = "$AIX_EXPORTS";
  bVar5 = cmLocalGenerator::IsSplitSwiftBuild
                    ((cmLocalGenerator *)(this->super_cmNinjaTargetGenerator).LocalGenerator);
  if (!bVar5) {
    cmGeneratorTarget::GetLinkerLanguage
              ((string *)local_4c8,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               config);
    iVar6 = std::__cxx11::string::compare(local_4c8);
    if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
      operator_delete((void *)local_4c8._0_8_,stack0xfffffffffffffb48 + 1);
    }
    if (iVar6 == 0) {
      local_518 = "$SWIFT_LIBRARY_NAME";
      local_510._0_8_ = "$SWIFT_MODULE";
      local_510._8_8_ = "$SWIFT_MODULE_NAME";
      local_4f8[0] = "$SWIFT_SOURCES";
      local_550._M_left = (_Base_ptr)0x8bba98;
      local_590._8_8_ = "$FLAGS";
      local_550._M_right = (_Base_ptr)0x8bbaa1;
    }
  }
  local_800._0_8_ = local_800 + 0x10;
  local_800._8_8_ = (pointer)0x0;
  local_800[0x10] = '\0';
  cmGeneratorTarget::GetLinkerLanguage
            ((string *)local_2d0,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  local_4c8._0_8_ = (pointer)0x6;
  local_4c8._8_8_ = "CMAKE_";
  stack0xfffffffffffffb48 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  auStack_4b0 = (undefined1  [8])local_2d0._8_8_;
  local_4a8 = (char *)local_2d0._0_8_;
  views._M_len = 2;
  views._M_array = (iterator)local_4c8;
  local_4a0 = (string *)local_2d0;
  cmCatViews(&local_7a0,views);
  if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
    operator_delete((void *)local_2d0._0_8_,(ulong)(local_2d0._16_8_ + 1));
  }
  bVar5 = cmGeneratorTarget::HasLinkDependencyFile
                    ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget,config);
  if (bVar5) {
    pcVar1 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    local_4c8._0_8_ = local_7a0._M_string_length;
    local_4c8._8_8_ = local_7a0._M_dataplus._M_p;
    stack0xfffffffffffffb48 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    auStack_4b0 = (undefined1  [8])0x16;
    local_4a8 = "_LINKER_DEPFILE_FORMAT";
    local_4a0 = (string *)0x0;
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_4c8;
    cmCatViews((string *)local_2d0,views_00);
    cmMakefile::GetDefinition(pcVar1,(string *)local_2d0);
    if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
      operator_delete((void *)local_2d0._0_8_,(ulong)(local_2d0._16_8_ + 1));
    }
    std::__cxx11::string::_M_assign((string *)&local_b8);
    std::__cxx11::string::_M_replace((ulong)&local_d8,0,local_d0,0x8bbcba);
  }
  local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7c0,local_7a0._M_dataplus._M_p,
             local_7a0._M_string_length + local_7a0._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&local_7c0);
  cVar9 = cmMakefile::GetDefinition
                    ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile,
                     &local_7c0);
  if (cVar9.Value == (string *)0x0) {
    std::__cxx11::string::_M_replace((ulong)local_800,0,(char *)local_800._8_8_,0x88c3f5);
  }
  else {
    std::__cxx11::string::_M_assign((string *)local_800);
  }
  if ((useResponseFile) && ((pointer)local_800._8_8_ != (pointer)0x0)) {
    std::__cxx11::string::_M_replace((ulong)&local_98,0,local_90,0x8bbc9a);
    std::__cxx11::string::_M_append(local_800,(ulong)local_98._M_p);
    pcVar7 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    pcVar12 = "$in_newline";
    if (pcVar7->UsingGCCOnWindows != false) {
      pcVar12 = "$in";
    }
    std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,(ulong)pcVar12);
    bVar5 = CheckUseResponseFileForLibraries(this,(string *)&local_7e0);
    if (bVar5) {
      std::__cxx11::string::append((char *)&local_78);
      local_5d0._M_allocated_capacity = (size_type)"";
    }
    else {
      local_5d0._M_allocated_capacity = (size_type)"$LINK_PATH $LINK_LIBRARIES";
    }
    bVar5 = cmLocalGenerator::IsSplitSwiftBuild
                      ((cmLocalGenerator *)(this->super_cmNinjaTargetGenerator).LocalGenerator);
    if (!bVar5) {
      cmGeneratorTarget::GetLinkerLanguage
                ((string *)local_4c8,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 config);
      iVar6 = std::__cxx11::string::compare(local_4c8);
      if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
        operator_delete((void *)local_4c8._0_8_,(ulong)(stack0xfffffffffffffb48 + 1));
      }
      if (iVar6 == 0) {
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8;
        pbVar13 = (pointer)local_800._0_8_;
        goto LAB_00480c7e;
      }
    }
    paVar11 = &local_5e0;
    pbVar13 = (pointer)local_800._0_8_;
  }
  else {
    paVar11 = &local_5d0;
    local_5e0._M_allocated_capacity = 0x8bbc19;
    pbVar13 = (pointer)0x8bc7f5;
  }
LAB_00480c7e:
  paVar11->_M_allocated_capacity = (size_type)pbVar13;
  local_598 = "$OBJECT_DIR";
  local_5e0._8_8_ = "$TARGET_FILE";
  local_578 = "$SONAME_FLAG";
  local_570._0_8_ = "$SONAME";
  local_570._M_parent = (_Base_ptr)0x8bc810;
  local_610._0_8_ = "$TARGET_PDB";
  local_740._0_8_ = local_730;
  local_740._8_8_ = 0;
  local_730[0] = '\0';
  local_760 = (cmRulePlaceholderExpander *)local_750;
  local_758 = 0;
  local_750[0] = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4c8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d0);
  cmGeneratorTarget::GetTargetVersion
            ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             (int *)&local_720,(int *)&local_6a0);
  std::ostream::operator<<(local_4c8,(_Rb_tree_color)local_720);
  std::ostream::operator<<(local_2d0,(int)local_6a0._M_dataplus._M_p);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_740,(string *)&local_840);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840._M_dataplus._M_p != &local_840.field_2) {
    operator_delete(local_840._M_dataplus._M_p,(ulong)(local_840.field_2._M_allocated_capacity + 1))
    ;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_760,(string *)&local_840);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840._M_dataplus._M_p != &local_840.field_2) {
    operator_delete(local_840._M_dataplus._M_p,(ulong)(local_840.field_2._M_allocated_capacity + 1))
    ;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d0);
  std::ios_base::~ios_base((ios_base *)local_260._M_local_buf);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4c8);
  std::ios_base::~ios_base((ios_base *)local_458._M_local_buf);
  local_600._M_p = (pointer)local_740._0_8_;
  local_5f8 = local_760;
  local_590._8_8_ = "$FLAGS";
  local_570._M_right = (_Base_ptr)0x8bc5a4;
  local_550._0_8_ = "$MANIFESTS";
  local_720 = (_Base_ptr)local_710;
  local_718 = (_Base_ptr)0x0;
  local_710[0] = _S_red;
  if (targetType != EXECUTABLE) {
    std::__cxx11::string::append((char *)&local_720);
    local_550._M_parent = local_720;
  }
  cmCommonTargetGenerator::GetLinkerLauncher(&local_6a0,(cmCommonTargetGenerator *)this,config);
  local_6c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_6b8 + 8);
  local_6b8._0_8_ = (pointer)0x0;
  local_6b8[8] = '\0';
  target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  local_4c8._0_8_ = local_4c8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"RULE_LAUNCH_LINK","");
  cmLocalGenerator::GetRuleLauncher
            (&local_310,(cmLocalGenerator *)pcVar2,target,(string *)local_4c8,config);
  if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
    operator_delete((void *)local_4c8._0_8_,(ulong)(stack0xfffffffffffffb48 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_string_length !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_2d0._0_8_ = local_310._M_string_length;
    local_2d0._8_8_ = local_310._M_dataplus._M_p;
    local_2d0._16_8_ = (char *)0x0;
    unique0x00005300 = auStack_4b0;
    local_4c8._0_8_ = (pointer)0x0;
    local_4c8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x1;
    auStack_4b0[0] = 0x20;
    local_2d0._24_8_ = 1;
    local_2a8 = 0;
    views_01._M_len = 2;
    views_01._M_array = (iterator)local_2d0;
    local_2b0._M_p = (pointer)unique0x00005300;
    cmCatViews(&local_840,views_01);
    std::__cxx11::string::operator=((string *)&local_6c0,(string *)&local_840);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_840._M_dataplus._M_p != &local_840.field_2) {
      operator_delete(local_840._M_dataplus._M_p,
                      (ulong)(local_840.field_2._M_allocated_capacity + 1));
    }
  }
  (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
    super_cmLocalGenerator.super_cmOutputConverter._vptr_cmOutputConverter[6])(&local_768);
  ComputeLinkCmd(&local_780,this,config);
  pbVar13 = local_780.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_780.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_780.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    s = local_780.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_4c8._0_8_ = local_6b8._0_8_;
      local_4c8._8_8_ = local_6c0;
      stack0xfffffffffffffb48 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_4a8 = (s->_M_dataplus)._M_p;
      auStack_4b0 = (undefined1  [8])s->_M_string_length;
      local_4a0 = (string *)0x0;
      views_02._M_len = 2;
      views_02._M_array = (iterator)local_4c8;
      cmCatViews((string *)local_2d0,views_02);
      std::__cxx11::string::operator=((string *)s,(string *)local_2d0);
      if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
        operator_delete((void *)local_2d0._0_8_,(ulong)(local_2d0._16_8_ + 1));
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                (local_768,(cmOutputConverter *)(this->super_cmNinjaTargetGenerator).LocalGenerator,
                 s,(RuleVariables *)local_620);
      s = s + 1;
      config = local_808;
    } while (s != pbVar13);
  }
  pcVar14 = local_4c8 + 0x10;
  __first = std::
            __remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<cmNinjaRemoveNoOpCommands>>
                      (local_780.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       local_780.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_780,(iterator)__first._M_current,
             (iterator)
             local_780.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  local_4c8._0_8_ = pcVar14;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4c8,"$PRE_LINK","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_insert_rval(&local_780,
                   (const_iterator)
                   local_780.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,(value_type *)local_4c8);
  if ((pointer)local_4c8._0_8_ != pcVar14) {
    operator_delete((void *)local_4c8._0_8_,(ulong)(stack0xfffffffffffffb48 + 1));
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[12]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_780,
             (char (*) [12])"$POST_BUILD");
  local_2d0._0_8_ = local_2d0 + 0x10;
  local_2d0._8_8_ = (char *)0x0;
  local_2d0._16_8_ = local_2d0._16_8_ & 0xffffffffffffff00;
  cmLocalNinjaGenerator::BuildCommandLine
            ((string *)local_4c8,(this->super_cmNinjaTargetGenerator).LocalGenerator,&local_780,
             config,config,(string *)local_2d0,(cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&local_138,(string *)local_4c8);
  if ((pointer)local_4c8._0_8_ != pcVar14) {
    operator_delete((void *)local_4c8._0_8_,(ulong)(stack0xfffffffffffffb48 + 1));
  }
  if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
    operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
  }
  cmGeneratorTarget::GetLinkerLanguage
            (&local_330,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  pcVar10 = GetVisibleTypeName(this);
  local_4c8._0_8_ = &DAT_00000011;
  local_4c8._8_8_ = "Rule for linking ";
  stack0xfffffffffffffb48 = 0;
  auStack_4b0 = (undefined1  [8])local_330._M_string_length;
  local_4a8 = local_330._M_dataplus._M_p;
  pcVar12 = local_2d0 + 0x18;
  local_2d0._0_8_ = (pointer)0x0;
  local_2d0._8_8_ = (char *)0x1;
  local_2d0[0x18] = 0x20;
  local_498._M_allocated_capacity = 1;
  local_488._M_p = (pointer)0x0;
  local_4a0 = &local_330;
  local_498._8_8_ = pcVar12;
  local_2d0._16_8_ = pcVar12;
  local_480 = (char *)strlen(pcVar10);
  local_478._8_8_ = 0;
  local_840.field_2._M_allocated_capacity = (long)&local_840.field_2 + 8;
  local_840._M_dataplus._M_p = (pointer)0x0;
  local_840._M_string_length = 1;
  local_840.field_2._M_local_buf[8] = 0x2e;
  local_468._M_p = (pointer)0x1;
  local_458._M_allocated_capacity = 0;
  views_03._M_len = 5;
  views_03._M_array = (iterator)local_4c8;
  local_478._M_allocated_capacity = (size_type)pcVar10;
  local_460 = (char *)local_840.field_2._M_allocated_capacity;
  cmCatViews(&local_6e0,views_03);
  std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_6e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  cmGeneratorTarget::GetLinkerLanguage
            (&local_6e0,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             local_808);
  pcVar10 = GetVisibleTypeName(this);
  local_4c8._0_8_ = (char *)0x8;
  local_4c8._8_8_ = "Linking ";
  stack0xfffffffffffffb48 = 0;
  auStack_4b0 = (undefined1  [8])local_6e0._M_string_length;
  local_4a8 = local_6e0._M_dataplus._M_p;
  local_2d0._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_2d0._8_8_ = (pointer)0x1;
  local_2d0[0x18] = 0x20;
  local_498._M_allocated_capacity = 1;
  local_488._M_p = (pointer)0x0;
  local_4a0 = &local_6e0;
  local_498._8_8_ = pcVar12;
  local_2d0._16_8_ = pcVar12;
  local_480 = (char *)strlen(pcVar10);
  local_478._8_8_ = 0;
  local_468._M_p = (pointer)0xd;
  local_460 = " $TARGET_FILE";
  local_458._M_allocated_capacity = 0;
  views_04._M_len = 5;
  views_04._M_array = (iterator)local_4c8;
  local_478._M_allocated_capacity = (size_type)pcVar10;
  cmCatViews(&local_840,views_04);
  std::__cxx11::string::operator=((string *)&local_118,(string *)&local_840);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840._M_dataplus._M_p != &local_840.field_2) {
    operator_delete(local_840._M_dataplus._M_p,(ulong)(local_840.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace((ulong)&local_58,0,local_50,0x8bc5ee);
  config = local_808;
  pcVar7 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar7,(cmNinjaRule *)local_158);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_780);
  if (local_768 != (cmRulePlaceholderExpander *)0x0) {
    (*(local_768->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if (local_6c0 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_6b8 + 8)) {
    operator_delete(local_6c0,CONCAT71(local_6b8._9_7_,local_6b8[8]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_6a0._M_dataplus._M_p._4_4_,(int)local_6a0._M_dataplus._M_p) !=
      &local_6a0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_6a0._M_dataplus._M_p._4_4_,(int)local_6a0._M_dataplus._M_p),
                    local_6a0.field_2._0_8_ + 1);
  }
  if (local_720 != (_Base_ptr)local_710) {
    operator_delete(local_720,CONCAT71(local_710._1_7_,local_710[0]) + 1);
  }
  if (local_760 != (cmRulePlaceholderExpander *)local_750) {
    operator_delete(local_760,CONCAT71(local_750._1_7_,local_750[0]) + 1);
  }
  if ((pointer)local_740._0_8_ != (pointer)local_730) {
    operator_delete((void *)local_740._0_8_,CONCAT71(local_730._1_7_,local_730[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
    operator_delete(local_7c0._M_dataplus._M_p,
                    CONCAT71(local_7c0.field_2._M_allocated_capacity._1_7_,
                             local_7c0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
    operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_800._0_8_ != (pointer)(local_800 + 0x10)) {
    operator_delete((void *)local_800._0_8_,CONCAT71(local_800._17_7_,local_800[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e0._M_allocated_capacity != &local_7d0) {
    operator_delete((void *)local_7e0._M_allocated_capacity,
                    CONCAT71(local_7d0._M_allocated_capacity._1_7_,local_7d0._M_local_buf[0]) + 1);
  }
  if ((_Rb_tree_node_base *)local_868._0_8_ != (_Rb_tree_node_base *)(local_868 + 0x10)) {
    operator_delete((void *)local_868._0_8_,local_868._16_8_ + 1);
  }
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_158);
LAB_00481690:
  TargetNames((Names *)local_158,this,config);
  if (((local_130 != local_110) ||
      ((local_130 != 0 && (iVar6 = bcmp(local_138._M_p,local_118._M_p,local_130), iVar6 != 0)))) &&
     (bVar5 = cmGeneratorTarget::IsFrameworkOnApple
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget), !bVar5)) {
    pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    psVar8 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    source._M_str = (psVar8->_M_dataplus)._M_p;
    source._M_len = psVar8->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)local_2d0,(cmOutputConverter *)pcVar2,source,SHELL,false);
    if (targetType == EXECUTABLE) {
      local_640 = &local_630;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_640,"CMAKE_SYMLINK_EXECUTABLE","");
      local_4c8._0_8_ = local_4c8 + 0x10;
      if (local_640 == &local_630) {
        auStack_4b0 = (undefined1  [8])pcStack_628;
      }
      else {
        local_4c8._0_8_ = local_640;
      }
      uStack_4b7 = uStack_62f;
      local_4c8[0x10] = local_630;
      local_4a8 = (char *)&local_498;
      local_4c8._8_8_ = local_638;
      local_638 = (char *)0x0;
      local_630 = '\0';
      local_4a0 = (string *)0x0;
      local_498._M_allocated_capacity = local_498._M_allocated_capacity & 0xffffffffffffff00;
      local_488._M_p = (pointer)&local_478;
      local_480 = (char *)0x0;
      local_478._M_allocated_capacity = local_478._M_allocated_capacity & 0xffffffffffffff00;
      local_468._M_p = (pointer)&local_458;
      local_460 = (char *)0x0;
      local_458._M_allocated_capacity = local_458._M_allocated_capacity & 0xffffffffffffff00;
      local_448._M_p = (pointer)&local_438;
      local_440 = (char *)0x0;
      local_438._M_local_buf[0] = '\0';
      local_428._M_p = (pointer)&local_418;
      local_420 = (char *)0x0;
      local_418._M_local_buf[0] = '\0';
      local_408._M_p = (pointer)&local_3f8;
      local_400 = (char *)0x0;
      local_3f8._M_local_buf[0] = '\0';
      local_3e8._M_p = (pointer)&local_3d8;
      local_3e0 = (char *)0x0;
      local_3d8._M_local_buf[0] = '\0';
      local_3c8._M_p = (pointer)&local_3b8;
      local_3c0 = (char *)0x0;
      local_3b8._M_local_buf[0] = '\0';
      local_3a8 = false;
      local_868._16_8_ = 0;
      local_868._0_8_ = (_Rb_tree_node_base *)0x0;
      local_868._8_8_ = (pointer)0x0;
      local_640 = &local_630;
      local_620._0_8_ = (RuleVariables *)local_610;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_620,local_2d0._0_8_,(pointer)(local_2d0._8_8_ + local_2d0._0_8_));
      std::__cxx11::string::append(local_620);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_868,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620);
      if ((RuleVariables *)local_620._0_8_ != (RuleVariables *)local_610) {
        operator_delete((void *)local_620._0_8_,(ulong)(local_610._0_8_ + 1));
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[12]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_868,
                 (char (*) [12])"$POST_BUILD");
      local_840._M_string_length = 0;
      local_840.field_2._M_allocated_capacity =
           local_840.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_840._M_dataplus._M_p = (pointer)&local_840.field_2;
      cmLocalNinjaGenerator::BuildCommandLine
                ((string *)local_620,(this->super_cmNinjaTargetGenerator).LocalGenerator,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_868,config,config,&local_840,(cmGeneratorTarget *)0x0);
      std::__cxx11::string::operator=((string *)&local_4a8,(string *)local_620);
      if ((RuleVariables *)local_620._0_8_ != (RuleVariables *)local_610) {
        operator_delete((void *)local_620._0_8_,(ulong)(local_610._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_840._M_dataplus._M_p != &local_840.field_2) {
        operator_delete(local_840._M_dataplus._M_p,
                        (ulong)(local_840.field_2._M_allocated_capacity + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_868);
      std::__cxx11::string::_M_replace((ulong)&local_488,0,local_480,0x8bc89a);
      std::__cxx11::string::_M_replace((ulong)&local_468,0,local_460,0x8bc8bb);
      pcVar7 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::AddRule(pcVar7,(cmNinjaRule *)local_4c8);
    }
    else {
      local_660 = &local_650;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_660,"CMAKE_SYMLINK_LIBRARY","");
      local_4c8._0_8_ = local_4c8 + 0x10;
      if (local_660 == &local_650) {
        auStack_4b0 = (undefined1  [8])pcStack_648;
      }
      else {
        local_4c8._0_8_ = local_660;
      }
      uStack_4b7 = uStack_64f;
      local_4c8[0x10] = local_650;
      local_4a8 = (char *)&local_498;
      local_4c8._8_8_ = local_658;
      local_658 = (char *)0x0;
      local_650 = '\0';
      local_4a0 = (string *)0x0;
      local_498._M_allocated_capacity = local_498._M_allocated_capacity & 0xffffffffffffff00;
      local_488._M_p = (pointer)&local_478;
      local_480 = (char *)0x0;
      local_478._M_allocated_capacity = local_478._M_allocated_capacity & 0xffffffffffffff00;
      local_468._M_p = (pointer)&local_458;
      local_460 = (char *)0x0;
      local_458._M_allocated_capacity = local_458._M_allocated_capacity & 0xffffffffffffff00;
      local_448._M_p = (pointer)&local_438;
      local_440 = (char *)0x0;
      local_438._M_local_buf[0] = '\0';
      local_428._M_p = (pointer)&local_418;
      local_420 = (char *)0x0;
      local_418._M_local_buf[0] = '\0';
      local_408._M_p = (pointer)&local_3f8;
      local_400 = (char *)0x0;
      local_3f8._M_local_buf[0] = '\0';
      local_3e8._M_p = (pointer)&local_3d8;
      local_3e0 = (char *)0x0;
      local_3d8._M_local_buf[0] = '\0';
      local_3c8._M_p = (pointer)&local_3b8;
      local_3c0 = (char *)0x0;
      local_3b8._M_local_buf[0] = '\0';
      local_3a8 = false;
      local_868._16_8_ = 0;
      local_868._0_8_ = (_Rb_tree_node_base *)0x0;
      local_868._8_8_ = (pointer)0x0;
      local_660 = &local_650;
      local_620._0_8_ = (RuleVariables *)local_610;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_620,local_2d0._0_8_,(pointer)(local_2d0._8_8_ + local_2d0._0_8_));
      std::__cxx11::string::append(local_620);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_868,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620);
      if ((RuleVariables *)local_620._0_8_ != (RuleVariables *)local_610) {
        operator_delete((void *)local_620._0_8_,(ulong)(local_610._0_8_ + 1));
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[12]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_868,
                 (char (*) [12])"$POST_BUILD");
      local_840._M_string_length = 0;
      local_840.field_2._M_allocated_capacity =
           local_840.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_840._M_dataplus._M_p = (pointer)&local_840.field_2;
      cmLocalNinjaGenerator::BuildCommandLine
                ((string *)local_620,(this->super_cmNinjaTargetGenerator).LocalGenerator,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_868,config,config,&local_840,(cmGeneratorTarget *)0x0);
      std::__cxx11::string::operator=((string *)&local_4a8,(string *)local_620);
      if ((RuleVariables *)local_620._0_8_ != (RuleVariables *)local_610) {
        operator_delete((void *)local_620._0_8_,(ulong)(local_610._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_840._M_dataplus._M_p != &local_840.field_2) {
        operator_delete(local_840._M_dataplus._M_p,
                        (ulong)(local_840.field_2._M_allocated_capacity + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_868);
      std::__cxx11::string::_M_replace((ulong)&local_488,0,local_480,0x8bc922);
      std::__cxx11::string::_M_replace((ulong)&local_468,0,local_460,0x8bc940);
      pcVar7 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::AddRule(pcVar7,(cmNinjaRule *)local_4c8);
    }
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_4c8);
    if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
      operator_delete((void *)local_2d0._0_8_,(ulong)(local_2d0._16_8_ + 1));
    }
  }
  bVar5 = cmGeneratorTarget::IsApple
                    ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  if ((bVar5) &&
     (bVar5 = cmGeneratorTarget::HasImportLibrary
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget,config), bVar5)) {
    TextStubsGeneratorRule(&local_350,this,config);
    local_2d0._0_8_ = local_2d0 + 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p == &local_350.field_2) {
      local_2d0._24_8_ = local_350.field_2._8_8_;
    }
    else {
      local_2d0._0_8_ = local_350._M_dataplus._M_p;
    }
    local_2d0._17_7_ = local_350.field_2._M_allocated_capacity._1_7_;
    local_2d0[0x10] = local_350.field_2._M_local_buf[0];
    local_2b0._M_p = (pointer)&local_2a0;
    local_2d0._8_8_ = local_350._M_string_length;
    local_350._M_string_length = 0;
    local_350.field_2._M_local_buf[0] = '\0';
    local_2a8 = 0;
    local_2a0._M_local_buf[0] = '\0';
    local_290._M_p = (pointer)&local_280;
    local_288 = (char *)0x0;
    local_280._M_local_buf[0] = '\0';
    local_270._M_p = (pointer)&local_260;
    local_268 = 0;
    local_260._M_local_buf[0] = '\0';
    local_250._M_p = (pointer)&local_240;
    local_248 = 0;
    local_240._M_local_buf[0] = '\0';
    local_230._M_p = (pointer)&local_220;
    local_228 = 0;
    local_220._M_local_buf[0] = '\0';
    local_210._M_p = (pointer)&local_200;
    local_208 = 0;
    local_200._M_local_buf[0] = '\0';
    local_1f0._M_p = (pointer)&local_1e0;
    local_1e8 = 0;
    local_1e0._M_local_buf[0] = '\0';
    local_1d0._M_p = (pointer)&local_1c0;
    local_1c8 = 0;
    local_1c0._M_local_buf[0] = '\0';
    local_1b0 = false;
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)GetVisibleTypeName(this);
    local_4c8._0_8_ = (pointer)0x29;
    local_4c8._8_8_ = "Rule for generating text-based stubs for ";
    stack0xfffffffffffffb48 = 0;
    auStack_4b0 = (undefined1  [8])strlen(paVar11->_M_local_buf);
    local_4a0 = (string *)0x0;
    local_610._0_8_ = local_610 + 8;
    local_620._0_8_ = (char *)0x0;
    local_620._8_8_ = (pointer)0x1;
    local_610[8] = 0x2e;
    local_498._M_allocated_capacity = 1;
    local_488._M_p = (pointer)0x0;
    views_05._M_len = 3;
    views_05._M_array = (iterator)local_4c8;
    local_4a8 = (char *)paVar11;
    local_498._8_8_ = local_610._0_8_;
    cmCatViews(&local_840,views_05);
    std::__cxx11::string::operator=((string *)&local_270,(string *)&local_840);
    paVar11 = &local_840.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_840._M_dataplus._M_p != paVar11) {
      operator_delete(local_840._M_dataplus._M_p,
                      (ulong)(local_840.field_2._M_allocated_capacity + 1));
    }
    std::__cxx11::string::_M_replace((ulong)&local_290,0,local_288,0x8bc98d);
    pcVar1 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile;
    local_4c8._0_8_ = local_4c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4c8,"CMAKE_CREATE_TEXT_STUBS","");
    psVar8 = (string *)cmMakefile::GetDefinition(pcVar1,(string *)local_4c8);
    if (psVar8 == (string *)0x0) {
      psVar8 = &cmValue::Empty_abi_cxx11_;
    }
    pcVar14 = (psVar8->_M_dataplus)._M_p;
    local_868._0_8_ = (_Rb_tree_node_base *)(local_868 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_868,pcVar14,pcVar14 + psVar8->_M_string_length);
    if ((undefined1 *)local_4c8._0_8_ != local_4c8 + 0x10) {
      operator_delete((void *)local_4c8._0_8_,stack0xfffffffffffffb48 + 1);
    }
    (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
      super_cmLocalGenerator.super_cmOutputConverter._vptr_cmOutputConverter[6])(&local_760);
    memset(local_4c8,0,0x158);
    pcVar3 = local_760;
    local_480 = "$in";
    local_620._0_8_ = (RuleVariables *)local_610;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"$out","");
    std::__cxx11::string::_M_assign((string *)&pcVar3->TargetImpLib);
    if ((RuleVariables *)local_620._0_8_ != (RuleVariables *)local_610) {
      operator_delete((void *)local_620._0_8_,(ulong)(local_610._0_8_ + 1));
    }
    cmRulePlaceholderExpander::ExpandRuleVariables
              (local_760,(cmOutputConverter *)(this->super_cmNinjaTargetGenerator).LocalGenerator,
               (string *)local_868,(RuleVariables *)local_4c8);
    pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    local_840._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_840,local_868._0_8_,(pointer)(local_868._0_8_ + local_868._8_8_));
    __l._M_len = 1;
    __l._M_array = &local_840;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_800,__l,(allocator_type *)&local_7a0);
    local_7e0._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_7d0._M_local_buf[0] = '\0';
    local_7e0._M_allocated_capacity = (size_type)&local_7d0;
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)local_620,pcVar2,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_800,local_808,local_808,(string *)&local_7e0,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=((string *)&local_2b0,(string *)local_620);
    if ((RuleVariables *)local_620._0_8_ != (RuleVariables *)local_610) {
      operator_delete((void *)local_620._0_8_,(ulong)(local_610._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7e0._M_allocated_capacity != &local_7d0) {
      operator_delete((void *)local_7e0._M_allocated_capacity,
                      CONCAT71(local_7d0._M_allocated_capacity._1_7_,local_7d0._M_local_buf[0]) + 1)
      ;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_800);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_840._M_dataplus._M_p != paVar11) {
      operator_delete(local_840._M_dataplus._M_p,
                      (ulong)(local_840.field_2._M_allocated_capacity + 1));
    }
    pcVar7 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar7,(cmNinjaRule *)local_2d0);
    if (((local_f0 != local_d0) ||
        ((local_f0 != (char *)0x0 &&
         (iVar6 = bcmp(local_f8._M_p,local_d8._M_p,(size_t)local_f0), iVar6 != 0)))) &&
       (bVar5 = cmGeneratorTarget::IsFrameworkOnApple
                          ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                           GeneratorTarget), !bVar5)) {
      local_680 = (RuleVariables *)local_670;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_680,"CMAKE_SYMLINK_IMPORT_LIBRARY","");
      if (local_680 == (RuleVariables *)local_670) {
        local_610._8_8_ = local_670._8_8_;
        local_620._0_8_ = (RuleVariables *)local_610;
      }
      else {
        local_620._0_8_ = local_680;
      }
      local_610._1_7_ = local_670._1_7_;
      local_610[0] = local_670[0];
      local_600._M_p = local_5f0;
      local_620._8_8_ = local_678;
      local_678 = (pointer)0x0;
      local_670[0] = 0;
      local_5f8 = (cmRulePlaceholderExpander *)0x0;
      local_5f0._0_8_ = local_5f0._0_8_ & 0xffffffffffffff00;
      local_5e0._M_allocated_capacity = (size_type)&local_5d0;
      local_5e0._8_8_ = (char *)0x0;
      local_5d0._M_allocated_capacity = local_5d0._M_allocated_capacity & 0xffffffffffffff00;
      local_5c0._M_p = (pointer)&local_5b0;
      local_5b8 = (char *)0x0;
      local_5b0._M_local_buf[0] = '\0';
      local_5a0._M_p = local_590;
      local_598 = (char *)0x0;
      local_590[0] = '\0';
      local_580._M_p = (pointer)&local_570;
      local_578 = (char *)0x0;
      local_570._0_8_ = local_570._0_8_ & 0xffffffffffffff00;
      local_570._M_left = &local_550;
      local_570._M_right = (_Base_ptr)0x0;
      local_550._0_8_ = local_550._0_8_ & 0xffffffffffffff00;
      local_550._M_left = (_Base_ptr)&local_530;
      local_550._M_right = (_Base_ptr)0x0;
      local_530._M_local_buf[0] = '\0';
      local_520._M_p = local_510;
      local_518 = (char *)0x0;
      local_510._0_8_ = local_510._0_8_ & 0xffffffffffffff00;
      local_500 = false;
      pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      local_680 = (RuleVariables *)local_670;
      psVar8 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      source_00._M_str = (psVar8->_M_dataplus)._M_p;
      source_00._M_len = psVar8->_M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                ((string *)&local_7e0,(cmOutputConverter *)pcVar2,source_00,SHELL,false);
      local_840._M_dataplus._M_p = (pointer)local_7e0._8_8_;
      local_840._M_string_length = local_7e0._M_allocated_capacity;
      local_840.field_2._M_allocated_capacity = 0;
      local_840.field_2._8_8_ = 0x2a;
      local_820 = " -E cmake_symlink_library $in $SONAME $out";
      local_818 = 0;
      views_06._M_len = 2;
      views_06._M_array = (iterator)&local_840;
      cmCatViews((string *)local_800,views_06);
      pcVar2 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_7a0,local_800._0_8_,
                 (char *)(local_800._0_8_ + (long)(_Alloc_hider *)local_800._8_8_));
      __l_00._M_len = 1;
      __l_00._M_array = &local_7a0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_740,__l_00,(allocator_type *)&local_720);
      local_7c0._M_string_length = 0;
      local_7c0.field_2._M_local_buf[0] = '\0';
      local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
      cmLocalNinjaGenerator::BuildCommandLine
                (&local_840,pcVar2,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_740,local_808,local_808,&local_7c0,(cmGeneratorTarget *)0x0);
      std::__cxx11::string::operator=((string *)&local_600,(string *)&local_840);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_840._M_dataplus._M_p != paVar11) {
        operator_delete(local_840._M_dataplus._M_p,
                        (ulong)(local_840.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
        operator_delete(local_7c0._M_dataplus._M_p,
                        CONCAT71(local_7c0.field_2._M_allocated_capacity._1_7_,
                                 local_7c0.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_740);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
        operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_800._0_8_ != (pointer)(local_800 + 0x10)) {
        operator_delete((void *)local_800._0_8_,CONCAT71(local_800._17_7_,local_800[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7e0._M_allocated_capacity != &local_7d0) {
        operator_delete((void *)local_7e0._M_allocated_capacity,
                        CONCAT71(local_7d0._M_allocated_capacity._1_7_,local_7d0._M_local_buf[0]) +
                        1);
      }
      std::__cxx11::string::_M_replace((ulong)&local_5e0,0,(char *)local_5e0._8_8_,0x8bc9e1);
      std::__cxx11::string::_M_replace((ulong)&local_5c0,0,local_5b8,0x8bca06);
      pcVar7 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::AddRule(pcVar7,(cmNinjaRule *)local_620);
      cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_620);
    }
    if (local_760 != (cmRulePlaceholderExpander *)0x0) {
      (*(local_760->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
    }
    if ((_Rb_tree_node_base *)local_868._0_8_ != (_Rb_tree_node_base *)(local_868 + 0x10)) {
      operator_delete((void *)local_868._0_8_,local_868._16_8_ + 1);
    }
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_2d0);
  }
  cmGeneratorTarget::Names::~Names((Names *)local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710._16_8_ != &local_6f0) {
    operator_delete((void *)local_710._16_8_,
                    CONCAT71(local_6f0._M_allocated_capacity._1_7_,local_6f0._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLinkRule(bool useResponseFile,
                                                 const std::string& config)
{
  cmStateEnums::TargetType targetType = this->GetGeneratorTarget()->GetType();

  std::string linkRuleName = this->LanguageLinkerRule(config);
  if (!this->GetGlobalGenerator()->HasRule(linkRuleName)) {
    cmNinjaRule rule(std::move(linkRuleName));
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType = cmState::GetTargetTypeName(targetType).c_str();

    std::string linker = this->GetGeneratorTarget()->GetLinkerTool(config);
    vars.Linker = linker.c_str();
    std::string lang = this->TargetLinkLanguage(config);
    vars.Language = lang.c_str();
    vars.AIXExports = "$AIX_EXPORTS";

    if (!this->GetLocalGenerator()->IsSplitSwiftBuild() &&
        this->TargetLinkLanguage(config) == "Swift") {
      vars.SwiftLibraryName = "$SWIFT_LIBRARY_NAME";
      vars.SwiftModule = "$SWIFT_MODULE";
      vars.SwiftModuleName = "$SWIFT_MODULE_NAME";
      vars.SwiftSources = "$SWIFT_SOURCES";

      vars.Defines = "$DEFINES";
      vars.Flags = "$FLAGS";
      vars.Includes = "$INCLUDES";
    }

    std::string responseFlag;

    std::string cmakeVarLang =
      cmStrCat("CMAKE_", this->TargetLinkLanguage(config));

    if (this->GeneratorTarget->HasLinkDependencyFile(config)) {
      auto DepFileFormat = this->GetMakefile()->GetDefinition(
        cmStrCat(cmakeVarLang, "_LINKER_DEPFILE_FORMAT"));
      rule.DepType = DepFileFormat;
      rule.DepFile = "$DEP_FILE";
    }

    // build response file name
    std::string cmakeLinkVar = cmakeVarLang + "_RESPONSE_FILE_LINK_FLAG";
    cmValue flag = this->GetMakefile()->GetDefinition(cmakeLinkVar);

    if (flag) {
      responseFlag = *flag;
    } else {
      responseFlag = "@";
    }

    if (!useResponseFile || responseFlag.empty()) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      rule.RspFile = "$RSP_FILE";
      responseFlag += rule.RspFile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rule.RspContent = "$in";
      } else {
        rule.RspContent = "$in_newline";
      }

      // If libraries in rsp is enable
      if (this->CheckUseResponseFileForLibraries(lang)) {
        rule.RspContent += " $LINK_PATH $LINK_LIBRARIES";
        vars.LinkLibraries = "";
      } else {
        vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
      }

      if (!this->GetLocalGenerator()->IsSplitSwiftBuild() &&
          this->TargetLinkLanguage(config) == "Swift") {
        vars.SwiftSources = responseFlag.c_str();
      } else {
        vars.Objects = responseFlag.c_str();
      }
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetInstallNameDir = "$INSTALLNAME_DIR";
    vars.TargetPDB = "$TARGET_PDB";

    // Setup the target version.
    std::string targetVersionMajor;
    std::string targetVersionMinor;
    {
      std::ostringstream majorStream;
      std::ostringstream minorStream;
      int major;
      int minor;
      this->GetGeneratorTarget()->GetTargetVersion(major, minor);
      majorStream << major;
      minorStream << minor;
      targetVersionMajor = majorStream.str();
      targetVersionMinor = minorStream.str();
    }
    vars.TargetVersionMajor = targetVersionMajor.c_str();
    vars.TargetVersionMinor = targetVersionMinor.c_str();

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    std::string langFlags;
    if (targetType != cmStateEnums::EXECUTABLE) {
      langFlags += "$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS";
      vars.LanguageCompileFlags = langFlags.c_str();
    }

    std::string linkerLauncher = this->GetLinkerLauncher(config);
    if (cmNonempty(linkerLauncher)) {
      vars.Launcher = linkerLauncher.c_str();
    }

    std::string launcher;
    std::string val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK", config);
    if (cmNonempty(val)) {
      launcher = cmStrCat(val, ' ');
    }

    auto rulePlaceholderExpander =
      this->GetLocalGenerator()->CreateRulePlaceholderExpander();

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeLinkCmd(config);
    for (std::string& linkCmd : linkCmds) {
      linkCmd = cmStrCat(launcher, linkCmd);
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   linkCmd, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cm::erase_if(linkCmds, cmNinjaRemoveNoOpCommands());

    linkCmds.insert(linkCmds.begin(), "$PRE_LINK");
    linkCmds.emplace_back("$POST_BUILD");
    rule.Command =
      this->GetLocalGenerator()->BuildCommandLine(linkCmds, config, config);

    // Write the linker rule with response file if needed.
    rule.Comment =
      cmStrCat("Rule for linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), '.');
    rule.Description =
      cmStrCat("Linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), " $TARGET_FILE");
    rule.Restat = "$RESTAT";
    this->GetGlobalGenerator()->AddRule(rule);
  }

  auto const tgtNames = this->TargetNames(config);
  if (tgtNames.Output != tgtNames.Real &&
      !this->GetGeneratorTarget()->IsFrameworkOnApple()) {
    std::string cmakeCommand =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
    if (targetType == cmStateEnums::EXECUTABLE) {
      cmNinjaRule rule("CMAKE_SYMLINK_EXECUTABLE");
      {
        std::vector<std::string> cmd;
        cmd.push_back(cmakeCommand + " -E cmake_symlink_executable $in $out");
        cmd.emplace_back("$POST_BUILD");
        rule.Command =
          this->GetLocalGenerator()->BuildCommandLine(cmd, config, config);
      }
      rule.Description = "Creating executable symlink $out";
      rule.Comment = "Rule for creating executable symlink.";
      this->GetGlobalGenerator()->AddRule(rule);
    } else {
      cmNinjaRule rule("CMAKE_SYMLINK_LIBRARY");
      {
        std::vector<std::string> cmd;
        cmd.push_back(cmakeCommand +
                      " -E cmake_symlink_library $in $SONAME $out");
        cmd.emplace_back("$POST_BUILD");
        rule.Command =
          this->GetLocalGenerator()->BuildCommandLine(cmd, config, config);
      }
      rule.Description = "Creating library symlink $out";
      rule.Comment = "Rule for creating library symlink.";
      this->GetGlobalGenerator()->AddRule(rule);
    }
  }

  if (this->GetGeneratorTarget()->IsApple() &&
      this->GetGeneratorTarget()->HasImportLibrary(config)) {
    cmNinjaRule rule(this->TextStubsGeneratorRule(config));
    rule.Comment = cmStrCat("Rule for generating text-based stubs for ",
                            this->GetVisibleTypeName(), '.');
    rule.Description = "Creating text-based stubs $out";

    std::string cmd =
      this->GetMakefile()->GetDefinition("CMAKE_CREATE_TEXT_STUBS");
    auto rulePlaceholderExpander =
      this->GetLocalGenerator()->CreateRulePlaceholderExpander();
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.Target = "$in";
    rulePlaceholderExpander->SetTargetImpLib("$out");
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                 cmd, vars);

    rule.Command =
      this->GetLocalGenerator()->BuildCommandLine({ cmd }, config, config);
    this->GetGlobalGenerator()->AddRule(rule);

    if (tgtNames.ImportOutput != tgtNames.ImportReal &&
        !this->GetGeneratorTarget()->IsFrameworkOnApple()) {
      cmNinjaRule slRule("CMAKE_SYMLINK_IMPORT_LIBRARY");
      {
        std::string cmakeCommand =
          this->GetLocalGenerator()->ConvertToOutputFormat(
            cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
        std::string slCmd =
          cmStrCat(cmakeCommand, " -E cmake_symlink_library $in $SONAME $out");
        slRule.Command = this->GetLocalGenerator()->BuildCommandLine(
          { slCmd }, config, config);
      }
      slRule.Description = "Creating import library symlink $out";
      slRule.Comment = "Rule for creating import library symlink.";
      this->GetGlobalGenerator()->AddRule(slRule);
    }
  }
}